

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O3

value * mjs::string_replace(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                           string *str,value *search_value,value *replace_value)

{
  value *this;
  gc_heap *pgVar1;
  undefined4 uVar2;
  bool bVar3;
  void *pvVar4;
  regexp_object *prVar5;
  size_type sVar6;
  long *plVar7;
  long *plVar8;
  uint *puVar9;
  undefined8 *puVar10;
  gc_heap_ptr_untyped *pgVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  undefined1 auVar15 [16];
  value match_1;
  wstring res;
  gc_heap_ptr<mjs::regexp_object> re;
  object_ptr o;
  object_ptr match;
  string search_string;
  value replace_val;
  undefined1 local_140 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_138;
  undefined1 local_118 [8];
  void *local_110;
  undefined1 local_108 [24];
  uint32_t local_f0;
  gc_heap_ptr_untyped local_e8;
  gc_heap_ptr_untyped local_d8;
  undefined1 local_c8 [16];
  value local_b8;
  allocation_context *local_90;
  gc_heap_ptr_untyped local_88;
  value *local_78;
  slot *local_70;
  wstring_view local_68;
  undefined1 local_58 [40];
  
  pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  pgVar1 = *(gc_heap **)((long)pvVar4 + 8);
  value::value((value *)local_58,replace_value);
  if ((local_58._0_4_ != object) ||
     (bVar3 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                        ((gc_heap_ptr_untyped *)(local_58 + 8)), !bVar3)) {
    to_string((mjs *)(local_c8 + 0x10),pgVar1,(value *)local_58);
    local_140._0_4_ = 4;
    local_138.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)CONCAT44(local_b8._4_4_,local_b8.type_);
    local_138.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
         local_b8.field_1._0_4_;
    if (local_138.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
        (gc_heap *)0x0) {
      gc_heap::attach(local_138.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_
                      ,(gc_heap_ptr_untyped *)((long)local_140 + 8));
    }
    value::operator=((value *)local_58,(value *)local_140);
    value::destroy((value *)local_140);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_c8 + 0x10));
  }
  if (search_value->type_ == object) {
    local_e8.heap_ =
         (search_value->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
         heap_;
    local_e8.pos_ = *(uint32_t *)((long)&search_value->field_1 + 8);
    if ((slot *)local_e8.heap_ != (slot *)0x0) {
      gc_heap::attach(local_e8.heap_,&local_e8);
    }
    bVar3 = gc_heap_ptr_untyped::has_type<mjs::regexp_object>(&local_e8);
    if (bVar3) {
      local_108._16_8_ = local_e8.heap_;
      local_f0 = local_e8.pos_;
      if ((slot *)local_e8.heap_ != (slot *)0x0) {
        gc_heap::attach(local_e8.heap_,(gc_heap_ptr_untyped *)(local_108 + 0x10));
      }
      pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_108 + 0x10));
      if ((*(byte *)((long)pvVar4 + 0x38) & 1) == 0) {
        prVar5 = (regexp_object *)
                 gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_108 + 0x10));
        regexp_object::exec((value *)local_140,prVar5,str);
        anon_unknown_35::do_replace
                  ((anon_unknown_35 *)(local_c8 + 0x10),str,(value *)local_140,(value *)local_58);
        __return_storage_ptr__->type_ = string;
        pgVar1 = (gc_heap *)CONCAT44(local_b8._4_4_,local_b8.type_);
        (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
        super_gc_heap_ptr_untyped.heap_ = pgVar1;
        *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_b8.field_1._0_4_;
        if (pgVar1 != (gc_heap *)0x0) {
          gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
        }
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_c8 + 0x10));
        value::destroy((value *)local_140);
      }
      else {
        local_70 = (slot *)local_108._16_8_;
        puVar9 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)str);
        local_d8.heap_ = (gc_heap *)local_c8;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_d8,puVar9 + 1,puVar9 + (ulong)*puVar9 + 1);
        local_78 = __return_storage_ptr__;
        pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_108 + 0x10));
        value_representation::value_representation((value_representation *)local_140,0.0);
        *(undefined1 (*) [8])((long)pvVar4 + 0x30) = local_140;
        local_118 = (undefined1  [8])local_108;
        local_110 = (void *)0x0;
        local_108._0_4_ = 0;
        uVar13 = 0;
        pgVar11 = (gc_heap_ptr_untyped *)(local_108 + 0x10);
        this = (value *)(local_c8 + 0x10);
        do {
          prVar5 = (regexp_object *)gc_heap_ptr_untyped::get(pgVar11);
          regexp_object::exec((value *)local_140,prVar5,str);
          uVar2 = local_140._0_4_;
          if (local_140._0_4_ != null) {
            if (local_140._0_4_ != object) {
LAB_001591ea:
              __assert_fail("match.type() == value_type::object",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                            ,0x181,
                            "string mjs::(anonymous namespace)::do_global_replace(const string &, const gc_heap_ptr<regexp_object> &, const value &)"
                           );
            }
            puVar10 = (undefined8 *)
                      gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)((long)local_140 + 8));
            local_68._M_len = 5;
            local_68._M_str = L"index";
            (**(code **)*puVar10)(this,puVar10,&local_68);
            if (local_b8.type_ != 3) {
              __assert_fail("type_ == value_type::number",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h"
                            ,0x44,"double mjs::value::number_value() const");
            }
            local_90 = (allocation_context *)CONCAT44(local_b8.field_1._4_4_,local_b8.field_1._0_4_)
            ;
            value::destroy(this);
            puVar9 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)str);
            uVar12 = uVar13 & 0xffffffff;
            if (*puVar9 < (uint)uVar13) {
              std::__throw_out_of_range_fmt(anon_var_dwarf_15df2,"basic_string_view::substr",uVar12)
              ;
              goto LAB_001591ea;
            }
            std::__cxx11::wstring::append((wchar_t *)local_118,(ulong)(puVar9 + uVar12 + 1));
            anon_unknown_35::do_get_replacement_string
                      ((anon_unknown_35 *)this,str,(object_ptr *)((long)local_140 + 8),
                       (value *)local_58);
            pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
            std::__cxx11::wstring::append((wchar_t *)local_118,(long)pvVar4 + 4);
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this);
            prVar5 = (regexp_object *)gc_heap_ptr_untyped::get(pgVar11);
            local_90 = (allocation_context *)regexp_object::last_index(prVar5);
            prVar5 = (regexp_object *)gc_heap_ptr_untyped::get(pgVar11);
            dVar14 = regexp_object::last_index(prVar5);
            uVar13 = (ulong)(double)local_90;
            if ((dVar14 == (double)uVar12) && (!NAN(dVar14) && !NAN((double)uVar12))) {
              pvVar4 = gc_heap_ptr_untyped::get(pgVar11);
              uVar13 = (ulong)((int)uVar13 + 1);
              value_representation::value_representation
                        ((value_representation *)this,(double)uVar13);
              *(ulong *)((long)pvVar4 + 0x30) = CONCAT44(local_b8._4_4_,local_b8.type_);
            }
          }
          value::destroy((value *)local_140);
          __return_storage_ptr__ = local_78;
        } while (uVar2 != null);
        if ((int)uVar13 == 0) {
          local_88.heap_ = (str->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
          local_88.pos_ = (str->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
          if (local_88.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_88.heap_,&local_88);
          }
        }
        else {
          if ((uVar13 & 0xffffffff) < CONCAT44(local_d8._12_4_,local_d8.pos_)) {
            std::__cxx11::wstring::substr((ulong)local_140,(ulong)&local_d8);
            std::__cxx11::wstring::_M_append((wchar_t *)local_118,(ulong)local_140);
            if (local_140 != (undefined1  [8])((long)local_140 + 0x10U)) {
              operator_delete((void *)local_140,
                              CONCAT44(local_138._12_4_,
                                       local_138.s_.super_gc_heap_ptr<mjs::gc_string>.
                                       super_gc_heap_ptr_untyped.pos_) * 4 + 4);
            }
          }
          local_140 = (undefined1  [8])local_110;
          local_138.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)local_118;
          string::string((string *)&local_88,(gc_heap *)&local_70->allocation,
                         (wstring_view *)local_140);
          __return_storage_ptr__ = local_78;
        }
        if (local_118 != (undefined1  [8])local_108) {
          operator_delete((void *)local_118,CONCAT44(local_108._4_4_,local_108._0_4_) * 4 + 4);
        }
        if (local_d8.heap_ != (gc_heap *)local_c8) {
          operator_delete(local_d8.heap_,local_c8._0_8_ * 4 + 4);
        }
        __return_storage_ptr__->type_ = string;
        (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
        super_gc_heap_ptr_untyped.heap_ = local_88.heap_;
        *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_88.pos_;
        if (local_88.heap_ != (gc_heap *)0x0) {
          gc_heap::attach(local_88.heap_,
                          (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
        }
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_108 + 0x10));
      pgVar11 = &local_e8;
      goto LAB_0015918c;
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
  }
  to_string((mjs *)(local_c8 + 0x10),pgVar1,search_value);
  puVar9 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)str);
  local_138.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)(puVar9 + 1);
  local_140 = (undefined1  [8])(ulong)*puVar9;
  puVar9 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_c8 + 0x10));
  sVar6 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::find
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_140,
                     (wchar_t *)(puVar9 + 1),0,(ulong)*puVar9);
  if (sVar6 == 0xffffffffffffffff) {
    __return_storage_ptr__->type_ = string;
    pgVar1 = (str->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = pgVar1;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) =
         (str->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
    if (pgVar1 != (gc_heap *)0x0) {
      gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
  }
  else {
    make_array((gc_heap_ptr<mjs::global_object> *)&local_d8,(uint32_t)global);
    plVar7 = (long *)gc_heap_ptr_untyped::get(&local_d8);
    local_68._M_len = 1;
    local_68._M_str = L"0";
    string::string((string *)local_118,pgVar1,&local_68);
    local_140._0_4_ = string;
    local_138.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
         local_b8.field_1._0_4_;
    if ((gc_heap *)CONCAT44(local_b8._4_4_,local_b8.type_) != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)CONCAT44(local_b8._4_4_,local_b8.type_),
                      (gc_heap_ptr_untyped *)((long)local_140 + 8));
    }
    (**(code **)(*plVar7 + 8))(plVar7,local_118,local_140,0);
    value::destroy((value *)local_140);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_118);
    plVar7 = (long *)gc_heap_ptr_untyped::get(&local_d8);
    plVar8 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar8 + 0x98))(local_118,plVar8,"index");
    auVar15._8_4_ = (int)(sVar6 >> 0x20);
    auVar15._0_8_ = sVar6;
    auVar15._12_4_ = 0x45300000;
    local_138.n_ = (auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0);
    local_140._0_4_ = number;
    (**(code **)(*plVar7 + 8))(plVar7,local_118,local_140,0);
    value::destroy((value *)local_140);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_118);
    local_140._0_4_ = 5;
    local_138.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_d8.heap_;
    local_138.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_d8.pos_;
    if (local_d8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d8.heap_,(gc_heap_ptr_untyped *)((long)local_140 + 8));
    }
    anon_unknown_35::do_replace
              ((anon_unknown_35 *)local_118,str,(value *)local_140,(value *)local_58);
    __return_storage_ptr__->type_ = string;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = (gc_heap *)local_118;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = (uint32_t)local_110;
    if (local_118 != (undefined1  [8])0x0) {
      gc_heap::attach((gc_heap *)local_118,
                      (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_118);
    value::destroy((value *)local_140);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
  }
  pgVar11 = (gc_heap_ptr_untyped *)(local_c8 + 0x10);
LAB_0015918c:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(pgVar11);
  value::destroy((value *)local_58);
  return __return_storage_ptr__;
}

Assistant:

value string_replace(const gc_heap_ptr<global_object>& global, const string& str, const value& search_value, const value& replace_value) {
    auto& h = global->heap();

    value replace_val = replace_value;
    if (replace_val.type() != value_type::object || !replace_val.object_value().has_type<function_object>()) {
        replace_val = value{to_string(h, replace_val)};
    }

    if (search_value.type() == value_type::object) {
        auto o = search_value.object_value();
        if (o.has_type<regexp_object>()) {
            gc_heap_ptr<regexp_object> re{o};
            if ((re->flags() & regexp_flag::global) == regexp_flag::none) {
                auto match = re->exec(str);
                return value{do_replace(str, match, replace_val)};
            }
            return value{do_global_replace(str, re, replace_val)};
        }
    }

    auto search_string = to_string(h, search_value);
    auto idx = str.view().find(search_string.view());
    if (idx == std::wstring_view::npos) {
        return value{str};
    }
    // Fake up a match object
    auto match = make_array(global, 0);
    match->put(string{h, L"0"}, value{search_string});
    match->put(global->common_string("index"), value{static_cast<double>(idx)});

    return value{do_replace(str, value{match}, replace_val)};
}